

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlErrValidNode(xmlValidCtxtPtr ctxt,xmlNodePtr node,xmlParserErrors error,char *msg,
                    xmlChar *str1,xmlChar *str2,xmlChar *str3)

{
  long lVar1;
  long delta;
  void *data;
  xmlParserCtxtPtr pctxt;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  xmlChar *str2_local;
  xmlChar *str1_local;
  char *msg_local;
  xmlParserErrors error_local;
  xmlNodePtr node_local;
  xmlValidCtxtPtr ctxt_local;
  
  pctxt = (xmlParserCtxtPtr)0x0;
  data = (void *)0x0;
  delta = 0;
  if (ctxt != (xmlValidCtxtPtr)0x0) {
    pctxt = (xmlParserCtxtPtr)ctxt->error;
    delta = (long)ctxt->userData;
    if ((((ctxt->finishDtd == 0xabcd1234) || (ctxt->finishDtd == 0xabcd1235)) &&
        (lVar1 = (long)ctxt - (long)ctxt->userData, 0 < lVar1)) && (lVar1 < 0xfa)) {
      data = ctxt->userData;
    }
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)pctxt,(void *)delta,data,node,
                  0x17,error,XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,(char *)str3,0,0,
                  msg,str1,str2,str3);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlErrValidNode(xmlValidCtxtPtr ctxt,
                xmlNodePtr node, xmlParserErrors error,
                const char *msg, const xmlChar * str1,
                const xmlChar * str2, const xmlChar * str3)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    xmlParserCtxtPtr pctxt = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        channel = ctxt->error;
        data = ctxt->userData;
	/* Use the special values to detect if it is part of a parsing
	   context */
	if ((ctxt->finishDtd == XML_CTXT_FINISH_DTD_0) ||
	    (ctxt->finishDtd == XML_CTXT_FINISH_DTD_1)) {
	    long delta = (char *) ctxt - (char *) ctxt->userData;
	    if ((delta > 0) && (delta < 250))
		pctxt = ctxt->userData;
	}
    }